

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char16_t,_char8_t>_>::TestBody
          (UnicodeFullTest_string_cast_Test<std::pair<char16_t,_char8_t>_> *this)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar2;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs;
  size_t sVar3;
  char16_t *pcVar4;
  char32_t (*in_RDX) [5];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *in_string;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar5;
  undefined8 extraout_RDX_04;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_string_00;
  long lVar6;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX_05;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX_06;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX_07;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX_08;
  pointer *__ptr;
  pointer *__ptr_1;
  bool bVar7;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs_00;
  AssertionResult gtest_ar_;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> abcd_string_view;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> abcd_str;
  long *local_88;
  AssertHelper local_80 [8];
  char local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_68;
  size_t local_48;
  char16_t *local_40;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_38;
  undefined8 extraout_RDX;
  
  jessilib::string_cast<char16_t,char32_t[5]>(&local_38,(jessilib *)L"ABCD",in_RDX);
  local_48 = local_38._M_string_length;
  local_40 = local_38._M_dataplus._M_p;
  jessilib::string_cast<char8_t,std::__cxx11::u16string>(&local_68,(jessilib *)&local_38,in_string);
  lhs_00._M_str = local_38._M_dataplus._M_p;
  lhs_00._M_len = local_38._M_string_length;
  rhs._M_str = local_68._M_dataplus._M_p;
  rhs._M_len = local_68._M_string_length;
  local_78[0] = jessilib::equals<char16_t,char8_t>(lhs_00,rhs);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  paVar2 = &local_68.field_2;
  uVar5 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_RDX_00;
  }
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_68,local_78,
               "equals(abcd_str, string_cast<typename TypeParam::second_type>(abcd_str))","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9d,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    uVar5 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_RDX_02;
    }
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
      uVar5 = extraout_RDX_03;
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
    uVar5 = extraout_RDX_04;
  }
  bVar7 = local_38._M_string_length == 0;
  in_string_00 = (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)
                 CONCAT71((int7)((ulong)uVar5 >> 8),bVar7);
  _Var1._M_p = local_38._M_dataplus._M_p;
  while (!bVar7) {
    lVar6 = 1;
    if ((local_38._M_string_length != 1) && ((*_Var1._M_p & 0xfc00U) == 0xd800)) {
      lVar6 = (ulong)((_Var1._M_p[1] & 0xfc00U) == 0xdc00) + 1;
    }
    _Var1._M_p = _Var1._M_p + lVar6;
    local_38._M_string_length = local_38._M_string_length - lVar6;
    bVar7 = local_38._M_string_length == 0;
    in_string_00 = (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)(ulong)bVar7;
  }
  local_78[0] = (char)in_string_00;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_68,local_78,"is_valid(abcd_str)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9e,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    in_string_00 = extraout_RDX_05;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      in_string_00 = extraout_RDX_06;
    }
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
      in_string_00 = extraout_RDX_07;
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
    in_string_00 = extraout_RDX_08;
  }
  lhs._M_str = local_40;
  lhs._M_len = local_48;
  jessilib::string_cast<char8_t,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (&local_68,(jessilib *)&local_48,in_string_00);
  rhs_00._M_str = local_68._M_dataplus._M_p;
  rhs_00._M_len = local_68._M_string_length;
  local_78[0] = jessilib::equals<char16_t,char8_t>(lhs,rhs_00);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_68,local_78,
               "equals(abcd_string_view, string_cast<typename TypeParam::second_type>(abcd_string_view))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa1,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
  }
  sVar3 = local_48;
  pcVar4 = local_40;
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
    sVar3 = local_48;
    pcVar4 = local_40;
  }
  for (; local_78[0] = sVar3 == 0, !(bool)local_78[0]; sVar3 = sVar3 - lVar6) {
    lVar6 = 1;
    if ((sVar3 != 1) && ((*pcVar4 & 0xfc00U) == 0xd800)) {
      lVar6 = (ulong)((pcVar4[1] & 0xfc00U) == 0xdc00) + 1;
    }
    pcVar4 = pcVar4 + lVar6;
  }
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_78[0]) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_68,local_78,"is_valid(abcd_string_view)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa2,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}